

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void close_state(lua_State *L)

{
  global_State *pgVar1;
  char *pcVar2;
  global_State *g;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  luaF_close(L,L->stack);
  luaC_freeallobjects(L);
  luaM_realloc_(L,(L->l_G->strt).hash,(long)(L->l_G->strt).size << 3,0);
  pcVar2 = (char *)luaM_realloc_(L,(pgVar1->buff).buffer,(pgVar1->buff).buffsize,0);
  (pgVar1->buff).buffer = pcVar2;
  (pgVar1->buff).buffsize = 0;
  freestack(L);
  (*pgVar1->frealloc)(pgVar1->ud,L,0x2c0,0);
  return;
}

Assistant:

static void close_state (lua_State *L) {
  global_State *g = G(L);
  luaF_close(L, L->stack);  /* close all upvalues for this thread */
  luaC_freeallobjects(L);  /* collect all objects */
  if (g->version)  /* closing a fully built state? */
    luai_userstateclose(L);
  luaM_freearray(L, G(L)->strt.hash, G(L)->strt.size);
  luaZ_freebuffer(L, &g->buff);
  freestack(L);
  lua_assert(gettotalbytes(g) == sizeof(LG));
  (*g->frealloc)(g->ud, fromstate(L), sizeof(LG), 0);  /* free main block */
}